

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texturetests.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_c633::ktxTexture_calcImageSize_ImageSizeAtEachLevelRGB2D_Test::TestBody
          (ktxTexture_calcImageSize_ImageSizeAtEachLevelRGB2D_Test *this)

{
  bool bVar1;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  ktx_size_t imageSize;
  ktx_uint32_t i;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  ktx_uint32_t ktx2sizes [4];
  ktx_uint32_t ktx1sizes [4];
  ktx_error_code_e result;
  TestCreateInfo createInfo;
  ktxTexture *texture;
  undefined4 uVar2;
  ktx_uint32_t in_stack_fffffffffffffe6c;
  undefined4 uVar3;
  ktx_uint32_t in_stack_fffffffffffffe74;
  undefined4 uVar4;
  ktx_uint32_t in_stack_fffffffffffffe7c;
  undefined4 uVar5;
  undefined4 in_stack_fffffffffffffe84;
  undefined4 in_stack_fffffffffffffe88;
  int in_stack_fffffffffffffe8c;
  char *in_stack_fffffffffffffe90;
  char *in_stack_fffffffffffffe98;
  AssertHelper *in_stack_fffffffffffffea0;
  ktx_uint32_t in_stack_fffffffffffffea8;
  char *in_stack_fffffffffffffed0;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  in_stack_fffffffffffffed8;
  char *in_stack_fffffffffffffee0;
  AssertionResult *in_stack_fffffffffffffee8;
  AssertHelper *in_stack_fffffffffffffef0;
  uint local_f8;
  string local_f0 [40];
  undefined8 local_c8;
  undefined1 local_b1;
  AssertionResult local_b0 [3];
  undefined4 local_7c;
  AssertionResult local_78;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined4 local_44;
  undefined1 local_40 [32];
  uint local_20;
  long local_10 [2];
  
  local_10[0] = 0;
  uVar2 = 0x17;
  uVar3 = 0;
  uVar4 = 1;
  uVar5 = 1;
  TestCreateInfo::TestCreateInfo
            ((TestCreateInfo *)CONCAT44(in_stack_fffffffffffffe84,1),in_stack_fffffffffffffe7c,1,
             in_stack_fffffffffffffe74,0,in_stack_fffffffffffffe6c,
             (ktx_uint32_t)in_stack_fffffffffffffe90,false,(ktx_uint32_t)in_stack_fffffffffffffea0,
             in_stack_fffffffffffffea8);
  local_58 = 0x30000000fc;
  local_50 = 0x400000010;
  local_68 = 0x30000000f3;
  local_60 = 0x30000000c;
  local_44 = ktxTexture1_Create(local_40,0,local_10);
  local_7c = 0;
  testing::internal::EqHelper::Compare<ktx_error_code_e,_ktx_error_code_e,_nullptr>
            ((char *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
             (char *)CONCAT44(in_stack_fffffffffffffe84,uVar5),
             (ktx_error_code_e *)CONCAT44(in_stack_fffffffffffffe7c,uVar4),
             (ktx_error_code_e *)CONCAT44(in_stack_fffffffffffffe74,uVar3));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_78);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffea0);
    testing::AssertionResult::failure_message((AssertionResult *)0x13ff35);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffea0,(Type)((ulong)in_stack_fffffffffffffe98 >> 0x20),
               in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c,
               (char *)CONCAT44(in_stack_fffffffffffffe84,uVar5));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffef0,(Message *)in_stack_fffffffffffffee8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffffe74,uVar3));
    testing::Message::~Message((Message *)0x13ff92);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x140000);
  local_b1 = local_10[0] != 0;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT44(in_stack_fffffffffffffe74,uVar3),
             (bool *)CONCAT44(in_stack_fffffffffffffe6c,uVar2),(type *)0x14002e);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_b0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffea0);
    testing::Message::operator<<
              ((Message *)CONCAT44(in_stack_fffffffffffffe74,uVar3),
               (char (*) [28])CONCAT44(in_stack_fffffffffffffe6c,uVar2));
    local_c8 = ktxErrorString(local_44);
    in_stack_fffffffffffffea0 =
         (AssertHelper *)
         testing::Message::operator<<
                   ((Message *)CONCAT44(in_stack_fffffffffffffe74,uVar3),
                    (char **)CONCAT44(in_stack_fffffffffffffe6c,uVar2));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
               (char *)in_stack_fffffffffffffed8._M_head_impl,in_stack_fffffffffffffed0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffea0,(Type)((ulong)in_stack_fffffffffffffe98 >> 0x20),
               in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c,
               (char *)CONCAT44(in_stack_fffffffffffffe84,uVar5));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffef0,(Message *)in_stack_fffffffffffffee8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffffe74,uVar3));
    std::__cxx11::string::~string(local_f0);
    testing::Message::~Message((Message *)0x140152);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1401ff);
  if (bVar1) {
    for (local_f8 = 0; local_f8 < local_20; local_f8 = local_f8 + 1) {
      ktxTexture_calcImageSize(local_10[0],local_f8,1);
      testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
                ((char *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                 (char *)CONCAT44(in_stack_fffffffffffffe84,uVar5),
                 (unsigned_long *)CONCAT44(in_stack_fffffffffffffe7c,uVar4),
                 (uint *)CONCAT44(in_stack_fffffffffffffe74,uVar3));
      bVar1 = testing::AssertionResult::operator_cast_to_bool
                        ((AssertionResult *)&stack0xfffffffffffffef0);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffea0);
        in_stack_fffffffffffffe98 =
             testing::AssertionResult::failure_message((AssertionResult *)0x1402d0);
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffea0,(Type)((ulong)in_stack_fffffffffffffe98 >> 0x20),
                   in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c,
                   (char *)CONCAT44(in_stack_fffffffffffffe84,uVar5));
        testing::internal::AssertHelper::operator=
                  (in_stack_fffffffffffffef0,(Message *)in_stack_fffffffffffffee8);
        testing::internal::AssertHelper::~AssertHelper
                  ((AssertHelper *)CONCAT44(in_stack_fffffffffffffe74,uVar3));
        testing::Message::~Message((Message *)0x140324);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x14038f);
      ktxTexture_calcImageSize(local_10[0],local_f8,2);
      testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
                ((char *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                 (char *)CONCAT44(in_stack_fffffffffffffe84,uVar5),
                 (unsigned_long *)CONCAT44(in_stack_fffffffffffffe7c,uVar4),
                 (uint *)CONCAT44(in_stack_fffffffffffffe74,uVar3));
      bVar1 = testing::AssertionResult::operator_cast_to_bool
                        ((AssertionResult *)&stack0xfffffffffffffed0);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffea0);
        in_stack_fffffffffffffe90 =
             testing::AssertionResult::failure_message((AssertionResult *)0x140423);
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffea0,(Type)((ulong)in_stack_fffffffffffffe98 >> 0x20),
                   in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c,
                   (char *)CONCAT44(in_stack_fffffffffffffe84,uVar5));
        testing::internal::AssertHelper::operator=
                  (in_stack_fffffffffffffef0,(Message *)in_stack_fffffffffffffee8);
        testing::internal::AssertHelper::~AssertHelper
                  ((AssertHelper *)CONCAT44(in_stack_fffffffffffffe74,uVar3));
        testing::Message::~Message((Message *)0x140471);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x1404d3);
    }
    if (local_10[0] != 0) {
      (*(code *)**(undefined8 **)(local_10[0] + 8))(local_10[0]);
    }
  }
  return;
}

Assistant:

TEST(ktxTexture_calcImageSize, ImageSizeAtEachLevelRGB2D) {
    ktxTexture* texture = 0;
    TestCreateInfo createInfo(9, 9, 1, 2, GL_RGB8,
                              VK_FORMAT_R8G8B8_UNORM, KTX_FALSE, 1, 1);
    KTX_error_code result;
    // Sizes for 9x9, 4 level RGB8 texture.
    // level 0 ... level 4
    ktx_uint32_t ktx1sizes[] = {28*9, 12*4, 8*2, 4*1};
    ktx_uint32_t ktx2sizes[] = {27*9, 12*4, 6*2, 3*1};

    result = ktxTexture1_Create(&createInfo, KTX_TEXTURE_CREATE_NO_STORAGE,
                                (ktxTexture1**)&texture);
    EXPECT_EQ(result, KTX_SUCCESS);
    ASSERT_TRUE(texture != NULL) << "ktxTexture1_Create failed: "
                                 << ktxErrorString(result);
    for (ktx_uint32_t i = 0; i < createInfo.numLevels; i++) {
        ktx_size_t imageSize;
        imageSize = ktxTexture_calcImageSize(texture, i,
                                             KTX_FORMAT_VERSION_ONE);
        EXPECT_EQ(imageSize, ktx1sizes[i]);
        imageSize = ktxTexture_calcImageSize(texture, i,
                                             KTX_FORMAT_VERSION_TWO);
        EXPECT_EQ(imageSize, ktx2sizes[i]);
    }
    if (texture)
        ktxTexture_Destroy(texture);
}